

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtVector3.h
# Opt level: O3

int bt_plane_clip_polygon
              (cbtVector4 *plane,cbtVector3 *polygon_points,int polygon_point_count,
              cbtVector3 *clipped)

{
  undefined8 *puVar1;
  float fVar2;
  ulong uVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint uVar8;
  long lVar9;
  long lVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  float fVar16;
  
  auVar13 = vfmadd231ss_fma(ZEXT416((uint)(polygon_points->m_floats[1] *
                                          (plane->super_cbtVector3).m_floats[1])),
                            ZEXT416((uint)polygon_points->m_floats[0]),
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[0]));
  auVar13 = vfmadd132ss_fma(ZEXT416((uint)polygon_points->m_floats[2]),auVar13,
                            ZEXT416((uint)(plane->super_cbtVector3).m_floats[2]));
  fVar4 = auVar13._0_4_ - (plane->super_cbtVector3).m_floats[3];
  if (fVar4 <= 1.1920929e-07) {
    uVar6 = *(undefined8 *)(polygon_points->m_floats + 2);
    *(undefined8 *)clipped->m_floats = *(undefined8 *)polygon_points->m_floats;
    *(undefined8 *)(clipped->m_floats + 2) = uVar6;
  }
  uVar8 = (uint)(fVar4 <= 1.1920929e-07);
  auVar11 = ZEXT416((uint)fVar4);
  auVar13 = auVar11;
  if (1 < polygon_point_count) {
    lVar10 = 0x10;
    auVar15 = auVar11;
    do {
      uVar3 = *(ulong *)((long)polygon_points->m_floats + lVar10);
      auVar14._8_8_ = 0;
      auVar14._0_8_ = uVar3;
      fVar2 = *(float *)((long)polygon_points->m_floats + lVar10 + 8);
      uVar6 = vcmpps_avx512vl(SUB6416(ZEXT464(0x34000000),0),auVar15,5);
      auVar13 = vmovshdup_avx(auVar14);
      auVar13 = vfmadd231ss_fma(ZEXT416((uint)(auVar13._0_4_ * (plane->super_cbtVector3).m_floats[1]
                                              )),auVar14,
                                ZEXT416((uint)(plane->super_cbtVector3).m_floats[0]));
      auVar13 = vfmadd231ss_fma(auVar13,ZEXT416((uint)fVar2),
                                ZEXT416((uint)(plane->super_cbtVector3).m_floats[2]));
      fVar12 = auVar13._0_4_ - (plane->super_cbtVector3).m_floats[3];
      auVar13 = ZEXT416((uint)fVar12);
      uVar7 = vcmpps_avx512vl(SUB6416(ZEXT464(0x34000000),0),ZEXT416((uint)fVar12),1);
      if ((((ushort)uVar6 ^ (ushort)uVar7) & 1) == 0) {
        uVar6 = *(undefined8 *)((long)polygon_points[-1].m_floats + lVar10);
        lVar9 = (long)(int)uVar8;
        uVar8 = uVar8 + 1;
        fVar16 = -auVar15._0_4_ / (fVar12 - auVar15._0_4_);
        fVar5 = 1.0 - fVar16;
        auVar15._0_4_ = fVar5 * (float)uVar6 + (float)uVar3 * fVar16;
        auVar15._4_4_ = fVar5 * (float)((ulong)uVar6 >> 0x20) + (float)(uVar3 >> 0x20) * fVar16;
        auVar15._8_4_ = fVar5 * 0.0 + fVar16 * 0.0;
        auVar15._12_4_ = fVar5 * 0.0 + fVar16 * 0.0;
        auVar15 = vinsertps_avx(auVar15,ZEXT416((uint)(fVar2 * fVar16 +
                                                      fVar5 * *(float *)((long)polygon_points->
                                                                               m_floats +
                                                                        lVar10 + -8))),0x28);
        *(undefined1 (*) [16])clipped[lVar9].m_floats = auVar15;
      }
      if (fVar12 <= 1.1920929e-07) {
        puVar1 = (undefined8 *)((long)polygon_points->m_floats + lVar10);
        lVar9 = (long)(int)uVar8;
        uVar6 = puVar1[1];
        uVar8 = uVar8 + 1;
        *(undefined8 *)clipped[lVar9].m_floats = *puVar1;
        *(undefined8 *)(clipped[lVar9].m_floats + 2) = uVar6;
      }
      lVar10 = lVar10 + 0x10;
      auVar15 = ZEXT416((uint)fVar12);
    } while ((ulong)(uint)polygon_point_count << 4 != lVar10);
  }
  uVar6 = vcmpps_avx512vl(SUB6416(ZEXT464(0x34000000),0),auVar13,5);
  uVar7 = vcmpps_avx512vl(SUB6416(ZEXT464(0x34000000),0),auVar11,1);
  if ((((ushort)uVar7 ^ (ushort)uVar6) & 1) == 0) {
    auVar11._8_4_ = 0x80000000;
    auVar11._0_8_ = 0x8000000080000000;
    auVar11._12_4_ = 0x80000000;
    auVar11 = vxorps_avx512vl(auVar13,auVar11);
    lVar10 = (long)(int)uVar8;
    uVar8 = uVar8 + 1;
    fVar12 = auVar11._0_4_ / (fVar4 - auVar13._0_4_);
    fVar2 = 1.0 - fVar12;
    auVar13._0_4_ =
         fVar2 * (float)*(undefined8 *)polygon_points[(long)polygon_point_count + -1].m_floats +
         fVar12 * (float)*(undefined8 *)polygon_points->m_floats;
    auVar13._4_4_ =
         fVar2 * (float)((ulong)*(undefined8 *)
                                 polygon_points[(long)polygon_point_count + -1].m_floats >> 0x20) +
         fVar12 * (float)((ulong)*(undefined8 *)polygon_points->m_floats >> 0x20);
    auVar13._8_4_ = fVar2 * 0.0 + fVar12 * 0.0;
    auVar13._12_4_ = fVar2 * 0.0 + fVar12 * 0.0;
    auVar13 = vinsertps_avx(auVar13,ZEXT416((uint)(fVar2 * polygon_points
                                                           [(long)polygon_point_count + -1].m_floats
                                                           [2] +
                                                  fVar12 * polygon_points->m_floats[2])),0x28);
    *(undefined1 (*) [16])clipped[lVar10].m_floats = auVar13;
  }
  if (fVar4 <= 1.1920929e-07) {
    uVar6 = *(undefined8 *)(polygon_points->m_floats + 2);
    lVar10 = (long)(int)uVar8;
    uVar8 = uVar8 + 1;
    *(undefined8 *)clipped[lVar10].m_floats = *(undefined8 *)polygon_points->m_floats;
    *(undefined8 *)(clipped[lVar10].m_floats + 2) = uVar6;
  }
  return uVar8;
}

Assistant:

SIMD_FORCE_INLINE cbtScalar dot(const cbtVector3& v) const
	{
#if defined BT_USE_SIMD_VECTOR3 && defined(BT_USE_SSE_IN_API) && defined(BT_USE_SSE)
		__m128 vd = _mm_mul_ps(mVec128, v.mVec128);
		__m128 z = _mm_movehl_ps(vd, vd);
		__m128 y = _mm_shuffle_ps(vd, vd, 0x55);
		vd = _mm_add_ss(vd, y);
		vd = _mm_add_ss(vd, z);
		return _mm_cvtss_f32(vd);
#elif defined(BT_USE_NEON)
		float32x4_t vd = vmulq_f32(mVec128, v.mVec128);
		float32x2_t x = vpadd_f32(vget_low_f32(vd), vget_low_f32(vd));
		x = vadd_f32(x, vget_high_f32(vd));
		return vget_lane_f32(x, 0);
#else
		return m_floats[0] * v.m_floats[0] +
			   m_floats[1] * v.m_floats[1] +
			   m_floats[2] * v.m_floats[2];
#endif
	}